

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfswindow.cpp
# Opt level: O0

void __thiscall QEglFSWindow::invalidateSurface(QEglFSWindow *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  AtomicBools AVar4;
  QEglFSScreen *pQVar5;
  EGLDisplay pvVar6;
  char *pcVar7;
  undefined8 uVar8;
  QEglFSDeviceIntegration *pQVar9;
  QLoggingCategory *in_RDI;
  long in_FS_OFFSET;
  undefined1 uVar10;
  bool ok_1;
  bool ok;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  QLoggingCategory *file;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  QDebug *in_stack_ffffffffffffff58;
  QDebug local_88;
  char local_80 [8];
  char *in_stack_ffffffffffffff88;
  QDebug local_40;
  undefined8 local_38;
  ulong local_30;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI[2].name != (char *)0x0) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    file = in_RDI;
    QtPrivateLogging::qLcEglDevDebug();
    anon_unknown.dwarf_9a8ce::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT17(in_stack_ffffffffffffff47,
                        CONCAT16(in_stack_ffffffffffffff46,
                                 CONCAT24(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40))),
               in_RDI);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_9a8ce::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x1278bb);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (char *)file,
                 CONCAT13(in_stack_ffffffffffffff47,
                          CONCAT12(in_stack_ffffffffffffff46,in_stack_ffffffffffffff44)),
                 (char *)in_RDI,(char *)0x1278d1);
      QMessageLogger::debug();
      QDebug::operator<<(in_stack_ffffffffffffff58,in_stack_ffffffffffffff88);
      QDebug::operator<<(in_stack_ffffffffffffff58,in_stack_ffffffffffffff88);
      QDebug::operator<<((QDebug *)
                         CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(in_stack_ffffffffffffff46,
                                           CONCAT24(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40))),in_RDI);
      QDebug::~QDebug(&local_40);
      local_10 = local_10 & 0xffffffffffffff00;
    }
    pQVar5 = (QEglFSScreen *)(**(code **)((long)in_RDI->d + 0x18))();
    pvVar6 = QEglFSScreen::display(pQVar5);
    iVar2 = eglDestroySurface(pvVar6,in_RDI[2].name);
    uVar10 = iVar2 != 0;
    if (!(bool)uVar10) {
      local_28 = 0xaaaaaaaaaaaaaaaa;
      local_20 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::qLcEglDevDebug();
      anon_unknown.dwarf_9a8ce::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                 CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffff46,
                                          CONCAT24(in_stack_ffffffffffffff44,
                                                   in_stack_ffffffffffffff40))),in_RDI);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
        anon_unknown.dwarf_9a8ce::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x1279bc);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (char *)file,
                   CONCAT13(uVar10,CONCAT12(in_stack_ffffffffffffff46,in_stack_ffffffffffffff44)),
                   (char *)in_RDI,(char *)0x1279d2);
        uVar3 = eglGetError();
        QMessageLogger::warning
                  (local_80,
                   "QEglFSWindow::invalidateSurface() eglDestroySurface failed! Follow-up errors or memory leaks are possible. eglGetError(): %x"
                   ,(ulong)uVar3);
        local_20 = local_20 & 0xffffffffffffff00;
      }
    }
    pcVar7 = (char *)eglGetCurrentSurface(0x305a);
    if ((pcVar7 == in_RDI[2].name) ||
       (pcVar7 = (char *)eglGetCurrentSurface(0x3059), pcVar7 == in_RDI[2].name)) {
      uVar8 = eglGetCurrentDisplay();
      iVar2 = eglMakeCurrent(uVar8,0,0);
      in_stack_ffffffffffffff46 = iVar2 != 0;
      local_38 = 0xaaaaaaaaaaaaaaaa;
      local_30 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::qLcEglDevDebug();
      anon_unknown.dwarf_9a8ce::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffff46,
                                          CONCAT24(in_stack_ffffffffffffff44,
                                                   in_stack_ffffffffffffff40))),in_RDI);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
        anon_unknown.dwarf_9a8ce::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x127a9d);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (char *)file,
                   CONCAT13(uVar10,CONCAT12(in_stack_ffffffffffffff46,in_stack_ffffffffffffff44)),
                   (char *)in_RDI,(char *)0x127ab3);
        QMessageLogger::debug();
        QDebug::operator<<(in_stack_ffffffffffffff58,in_stack_ffffffffffffff88);
        QDebug::operator<<(in_stack_ffffffffffffff58,in_stack_ffffffffffffff88);
        QDebug::operator<<(in_stack_ffffffffffffff58,in_stack_ffffffffffffff88);
        QDebug::operator<<((QDebug *)
                           CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffff46,
                                                    CONCAT24(in_stack_ffffffffffffff44,
                                                             in_stack_ffffffffffffff40))),
                           SUB81((ulong)in_RDI >> 0x38,0));
        QDebug::~QDebug(&local_88);
        local_30 = local_30 & 0xffffffffffffff00;
      }
    }
    pQVar5 = (QEglFSScreen *)(**(code **)((long)in_RDI->d + 0x18))();
    pcVar7 = (char *)QEglFSScreen::primarySurface(pQVar5);
    if (pcVar7 == in_RDI[2].name) {
      pQVar5 = (QEglFSScreen *)(**(code **)((long)in_RDI->d + 0x18))();
      QEglFSScreen::setPrimarySurface(pQVar5,(EGLSurface)0x0);
    }
    in_RDI[2].name = (char *)0x0;
    AVar4 = (AtomicBools)
            QFlags<QEglFSWindow::Flag>::operator&
                      ((QFlags<QEglFSWindow::Flag> *)
                       CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffff46,
                                                CONCAT24(in_stack_ffffffffffffff44,
                                                         in_stack_ffffffffffffff40))),
                       (int)((ulong)in_RDI >> 0x20));
    in_RDI[3].field_2.bools = AVar4;
  }
  pQVar9 = qt_egl_device_integration();
  uVar8._0_4_ = in_RDI[2].field_2;
  uVar8._4_1_ = in_RDI[2].placeholder[0];
  uVar8._5_1_ = in_RDI[2].placeholder[1];
  uVar8._6_1_ = in_RDI[2].placeholder[2];
  uVar8._7_1_ = in_RDI[2].placeholder[3];
  (*pQVar9->_vptr_QEglFSDeviceIntegration[0x17])(pQVar9,uVar8);
  in_RDI[2].field_2 = (anon_union_4_2_7218e939_for_QLoggingCategory_2)0x0;
  in_RDI[2].placeholder[0] = false;
  in_RDI[2].placeholder[1] = false;
  in_RDI[2].placeholder[2] = false;
  in_RDI[2].placeholder[3] = false;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEglFSWindow::invalidateSurface()
{
    if (m_surface != EGL_NO_SURFACE) {
        qCDebug(qLcEglDevDebug) << Q_FUNC_INFO << " about to destroy EGLSurface: " << m_surface;

        bool ok = eglDestroySurface(screen()->display(), m_surface);

        if (!ok) {
            qCWarning(qLcEglDevDebug, "QEglFSWindow::invalidateSurface() eglDestroySurface failed!"
                                      " Follow-up errors or memory leaks are possible."
                                      " eglGetError(): %x", eglGetError());
        }

        if (eglGetCurrentSurface(EGL_READ) == m_surface ||
                eglGetCurrentSurface(EGL_DRAW) == m_surface) {
            bool ok = eglMakeCurrent(eglGetCurrentDisplay(), EGL_NO_DISPLAY, EGL_NO_DISPLAY, EGL_NO_CONTEXT);
            qCDebug(qLcEglDevDebug) << Q_FUNC_INFO << " due to eglDestroySurface on *currently* bound surface"
                                    << "we just called eglMakeCurrent(..,0,0,0)! It returned: " << ok;
        }

        if (screen()->primarySurface() == m_surface)
            screen()->setPrimarySurface(EGL_NO_SURFACE);

        m_surface = EGL_NO_SURFACE;
        m_flags = m_flags & ~Created;
    }
    qt_egl_device_integration()->destroyNativeWindow(m_window);
    m_window = 0;
}